

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

string * __thiscall
leveldb::log::LogTest::Read_abi_cxx11_(string *__return_storage_ptr__,LogTest *this)

{
  size_type sVar1;
  bool bVar2;
  Slice record;
  string scratch;
  allocator local_39;
  Slice local_38;
  string local_28;
  
  if (this->reading_ == false) {
    this->reading_ = true;
    sVar1 = (this->dest_).contents_._M_string_length;
    (this->source_).contents_.data_ = (this->dest_).contents_._M_dataplus._M_p;
    (this->source_).contents_.size_ = sVar1;
  }
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  local_38.data_ = "";
  local_38.size_ = 0;
  bVar2 = Reader::ReadRecord(this->reader_,&local_38,&local_28);
  if (bVar2) {
    Slice::ToString_abi_cxx11_(__return_storage_ptr__,&local_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"EOF",&local_39);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string Read() {
    if (!reading_) {
      reading_ = true;
      source_.contents_ = Slice(dest_.contents_);
    }
    std::string scratch;
    Slice record;
    if (reader_->ReadRecord(&record, &scratch)) {
      return record.ToString();
    } else {
      return "EOF";
    }
  }